

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall MutableS2ShapeIndex::ApplyUpdatesInternal(MutableS2ShapeIndex *this)

{
  bool bVar1;
  S2NullStream *pSVar2;
  type this_00;
  pointer *local_270;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *local_228;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> local_210;
  int local_1f8;
  int local_1f4;
  int face;
  int id;
  RemovedShape *pending_removal;
  iterator __end3;
  iterator __begin3;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *__range3;
  InteriorTracker tracker;
  undefined1 local_e8 [8];
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
  all_edges [6];
  BatchDescriptor *batch;
  iterator __end1;
  iterator __begin1;
  vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  *__range1;
  int i;
  undefined1 local_28 [8];
  vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  batches;
  MutableS2ShapeIndex *this_local;
  
  batches.
  super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  ::vector((vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
            *)local_28);
  GetUpdateBatches(this,(vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                         *)local_28);
  __range1._0_4_ = 0;
  __end1 = std::
           vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
           ::begin((vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                    *)local_28);
  batch = (BatchDescriptor *)
          std::
          vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
          ::end((vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                 *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<MutableS2ShapeIndex::BatchDescriptor_*,_std::vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>_>
                                     *)&batch), bVar1) {
    all_edges[5].
    super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<MutableS2ShapeIndex::BatchDescriptor_*,_std::vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>_>
                  ::operator*(&__end1);
    local_228 = (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 *)local_e8;
    do {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      vector(local_228);
      local_228 = local_228 + 1;
    } while (local_228 !=
             (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
              *)&all_edges[5].
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar2 = S2NullStream::operator<<
                       ((S2NullStream *)
                        ((long)&tracker.saved_ids_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                        (char (*) [7])"Batch ");
    tracker.saved_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._0_4_ = (int)__range1;
    pSVar2 = S2NullStream::operator<<
                       (pSVar2,(int *)&tracker.saved_ids_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
    pSVar2 = S2NullStream::operator<<(pSVar2,(char (*) [15])": shape_limit=");
    pSVar2 = S2NullStream::operator<<
                       (pSVar2,&(all_edges[5].
                                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->shape_id);
    pSVar2 = S2NullStream::operator<<(pSVar2,(char (*) [9])", edges=");
    S2NullStream::operator<<
              (pSVar2,&(all_edges[5].
                        super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->edge_id);
    ReserveSpace(this,(BatchDescriptor *)
                      all_edges[5].
                      super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                  *)local_e8);
    InteriorTracker::InteriorTracker((InteriorTracker *)&__range3);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->pending_removals_);
    if (bVar1) {
      this_00 = std::
                unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
                ::operator*(&this->pending_removals_);
      __end3 = std::
               vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
               ::begin(this_00);
      pending_removal =
           (RemovedShape *)
           std::
           vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
           ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
                                         *)&pending_removal), bVar1) {
        _face = __gnu_cxx::
                __normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
                ::operator*(&__end3);
        RemoveShape(this,_face,
                    (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                     *)local_e8,(InteriorTracker *)&__range3);
        __gnu_cxx::
        __normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
        ::operator++(&__end3);
      }
      std::
      unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
      ::reset(&this->pending_removals_,(pointer)0x0);
    }
    for (local_1f4 = this->pending_additions_begin_;
        local_1f4 <
        (all_edges[5].
         super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->shape_id; local_1f4 = local_1f4 + 1) {
      AddShape(this,local_1f4,
               (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                *)local_e8,(InteriorTracker *)&__range3);
    }
    for (local_1f8 = 0; local_1f8 < 6; local_1f8 = local_1f8 + 1) {
      UpdateFaceEdges(this,local_1f8,
                      (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                       *)&all_edges[(long)local_1f8 + -1].
                          super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (InteriorTracker *)&__range3);
      memset(&local_210,0,0x18);
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      vector(&local_210);
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      swap(&local_210,
           (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *)
           &all_edges[(long)local_1f8 + -1].
            super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      ~vector(&local_210);
    }
    this->pending_additions_begin_ =
         (all_edges[5].
          super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->shape_id;
    InteriorTracker::~InteriorTracker((InteriorTracker *)&__range3);
    local_270 = &all_edges[5].
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_270 = local_270 + -3;
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      ~vector((vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               *)local_270);
    } while (local_270 != (pointer *)local_e8);
    __gnu_cxx::
    __normal_iterator<MutableS2ShapeIndex::BatchDescriptor_*,_std::vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>_>
    ::operator++(&__end1);
    __range1._0_4_ = (int)__range1 + 1;
  }
  std::
  vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  ::~vector((vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
             *)local_28);
  return;
}

Assistant:

void MutableS2ShapeIndex::ApplyUpdatesInternal() {
  // Check whether we have so many edges to process that we should process
  // them in multiple batches to save memory.  Building the index can use up
  // to 20x as much memory (per edge) as the final index size.
  vector<BatchDescriptor> batches;
  GetUpdateBatches(&batches);
  int i = 0;
  for (const BatchDescriptor& batch : batches) {
    vector<FaceEdge> all_edges[6];
    S2_VLOG(1) << "Batch " << i++ << ": shape_limit=" << batch.additions_end
               << ", edges=" << batch.num_edges;

    ReserveSpace(batch, all_edges);
    InteriorTracker tracker;
    if (pending_removals_) {
      // The first batch implicitly includes all shapes being removed.
      for (const auto& pending_removal : *pending_removals_) {
        RemoveShape(pending_removal, all_edges, &tracker);
      }
      pending_removals_.reset(nullptr);
    }
    for (int id = pending_additions_begin_; id < batch.additions_end; ++id) {
      AddShape(id, all_edges, &tracker);
    }
    for (int face = 0; face < 6; ++face) {
      UpdateFaceEdges(face, all_edges[face], &tracker);
      // Save memory by clearing vectors after we are done with them.
      vector<FaceEdge>().swap(all_edges[face]);
    }
    pending_additions_begin_ = batch.additions_end;
  }
  // It is the caller's responsibility to update index_status_.
}